

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O1

Read<signed_char> __thiscall
Omega_h::mark_class_closures
          (Omega_h *this,Mesh *mesh,Int class_dim,vector<int,_std::allocator<int>_> *class_ids,
          Graph *nodes2ents)

{
  int *piVar1;
  Alloc *pAVar2;
  undefined8 uVar3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  char *pcVar5;
  Read<signed_char> RVar6;
  Read<signed_char> eq_marks;
  Read<signed_char> local_50;
  Graph local_40;
  Alloc *local_20;
  void *local_18;
  void *pvVar4;
  
  if ((nodes2ents->a2ab).write_.shared_alloc_.direct_ptr == (void *)0x0) {
    pcVar5 = "nodes2ents.a2ab.exists()";
    uVar3 = 0x8f;
  }
  else {
    if ((nodes2ents->ab2b).write_.shared_alloc_.direct_ptr != (void *)0x0) {
      get_eq_marks((Omega_h *)&local_20,mesh,class_dim,class_ids);
      local_40.a2ab.write_.shared_alloc_.alloc = (nodes2ents->a2ab).write_.shared_alloc_.alloc;
      if (((ulong)local_40.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
          local_40.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_40.a2ab.write_.shared_alloc_.alloc =
               (Alloc *)((local_40.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_40.a2ab.write_.shared_alloc_.alloc)->use_count =
               (local_40.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_40.a2ab.write_.shared_alloc_.direct_ptr =
           (nodes2ents->a2ab).write_.shared_alloc_.direct_ptr;
      local_40.ab2b.write_.shared_alloc_.alloc = (nodes2ents->ab2b).write_.shared_alloc_.alloc;
      if (((ulong)local_40.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
          local_40.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_40.ab2b.write_.shared_alloc_.alloc =
               (Alloc *)((local_40.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_40.ab2b.write_.shared_alloc_.alloc)->use_count =
               (local_40.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_40.ab2b.write_.shared_alloc_.direct_ptr =
           (nodes2ents->ab2b).write_.shared_alloc_.direct_ptr;
      local_50.write_.shared_alloc_.alloc = local_20;
      if (((ulong)local_20 & 7) == 0 && local_20 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_50.write_.shared_alloc_.alloc = (Alloc *)(local_20->size * 8 + 1);
        }
        else {
          local_20->use_count = local_20->use_count + 1;
        }
      }
      local_50.write_.shared_alloc_.direct_ptr = local_18;
      RVar6 = mark_down(this,&local_40,&local_50);
      pAVar2 = local_50.write_.shared_alloc_.alloc;
      pvVar4 = RVar6.write_.shared_alloc_.direct_ptr;
      if (((ulong)local_50.write_.shared_alloc_.alloc & 7) == 0 &&
          local_50.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_50.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_50.write_.shared_alloc_.alloc);
          operator_delete(pAVar2,0x48);
          pvVar4 = extraout_RDX;
        }
      }
      pAVar2 = local_40.ab2b.write_.shared_alloc_.alloc;
      if (((ulong)local_40.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
          local_40.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_40.ab2b.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_40.ab2b.write_.shared_alloc_.alloc);
          operator_delete(pAVar2,0x48);
          pvVar4 = extraout_RDX_00;
        }
      }
      pAVar2 = local_40.a2ab.write_.shared_alloc_.alloc;
      if (((ulong)local_40.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
          local_40.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_40.a2ab.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_40.a2ab.write_.shared_alloc_.alloc);
          operator_delete(pAVar2,0x48);
          pvVar4 = extraout_RDX_01;
        }
      }
      if (((ulong)local_20 & 7) == 0 && local_20 != (Alloc *)0x0) {
        piVar1 = &local_20->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_20);
          operator_delete(local_20,0x48);
          pvVar4 = extraout_RDX_02;
        }
      }
      RVar6.write_.shared_alloc_.direct_ptr = pvVar4;
      RVar6.write_.shared_alloc_.alloc = (Alloc *)this;
      return (Read<signed_char>)RVar6.write_.shared_alloc_;
    }
    pcVar5 = "nodes2ents.ab2b.exists()";
    uVar3 = 0x90;
  }
  fail("assertion %s failed at %s +%d\n",pcVar5,
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mark.cpp"
       ,uVar3);
}

Assistant:

Read<I8> mark_by_class_dim(Mesh* mesh, Int ent_dim, Int class_dim) {
  auto e2class_dim = mesh->get_array<I8>(ent_dim, "class_dim");
  return each_eq_to(e2class_dim, static_cast<I8>(class_dim));
}